

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall
dgPolyhedra::MarkAdjacentCoplanarFaces
          (dgPolyhedra *this,dgPolyhedra *polyhedraOut,dgEdge *face,HaF64 *pool,HaI32 strideInBytes)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  dgEdge *face_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  dgEdge *pdVar15;
  dgEdge *pdVar16;
  long lVar17;
  HaF64 *pool_00;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  dgPolyhedra *this_00;
  double dVar21;
  int iVar22;
  dgEdge *pdVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  undefined1 auVar48 [16];
  dgBigVector normal1;
  HaI32 faceIndex [4096];
  dgEdge *deleteEdge [4096];
  dgEdge *stack [4096];
  double dStack_14140;
  double dStack_14138;
  double dStack_14130;
  dgBigVector dStack_14128;
  HaF64 *pHStack_14108;
  int iStack_140fc;
  double dStack_140f8;
  double dStack_140f0;
  int iStack_140e4;
  dgPolyhedra *pdStack_140e0;
  double dStack_140d8;
  double dStack_140d0;
  double dStack_140c8;
  double dStack_140c0;
  double dStack_140b8;
  double dStack_140b0;
  double dStack_140a8;
  double dStack_140a0;
  double dStack_14098;
  double dStack_14090;
  double dStack_14088;
  undefined8 uStack_14080;
  dgPolyhedra *pdStack_14078;
  long lStack_14070;
  undefined1 auStack_14068 [16];
  dgBigVector dStack_14058;
  HaI32 aHStack_14038 [4096];
  dgEdge *apdStack_10038 [4096];
  dgEdge *local_8038 [4097];
  
  pdStack_140e0 = polyhedraOut;
  apdStack_10038[0] = face;
  if (face->m_incidentFace < 1) {
    __assert_fail("face->m_incidentFace > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                  ,0xc36,
                  "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                 );
  }
  pHStack_14108 = pool;
  FaceNormal(&dStack_14128,polyhedraOut,face,pool,strideInBytes);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dStack_14128.super_dgTemplateVector<double>.m_x;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       dStack_14128.super_dgTemplateVector<double>.m_y *
       dStack_14128.super_dgTemplateVector<double>.m_y;
  auVar24 = vfmadd231sd_fma(auVar24,auVar41,auVar41);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dStack_14128.super_dgTemplateVector<double>.m_z;
  auVar24 = vfmadd231sd_fma(auVar24,auVar45,auVar45);
  uVar20 = 1;
  dVar25 = auVar24._0_8_;
  if (dVar25 <= 9.999999960041972e-13) {
LAB_0087f5dd:
    if (0 < (int)uVar20) {
      uVar19 = 0;
      do {
        DeleteFace(this,apdStack_10038[uVar19]);
        uVar19 = uVar19 + 1;
      } while (uVar20 != uVar19);
    }
    return;
  }
  if (dVar25 < 0.0) {
    dStack_140a8 = dStack_14128.super_dgTemplateVector<double>.m_y;
    dStack_140f0 = dStack_14128.super_dgTemplateVector<double>.m_x;
    dStack_140f8 = dStack_14128.super_dgTemplateVector<double>.m_z;
    dVar26 = sqrt(dVar25);
    dVar25 = dStack_140a8;
    dStack_140b0 = dStack_140f8;
  }
  else {
    auVar24 = vsqrtsd_avx(auVar24,auVar24);
    dVar26 = auVar24._0_8_;
    dStack_140f0 = dStack_14128.super_dgTemplateVector<double>.m_x;
    dVar25 = dStack_14128.super_dgTemplateVector<double>.m_y;
    dStack_140b0 = dStack_14128.super_dgTemplateVector<double>.m_z;
  }
  dVar26 = 1.0 / dVar26;
  dStack_140f0 = dStack_140f0 * dVar26;
  dStack_140f8 = dVar25 * dVar26;
  dStack_140b0 = dStack_140b0 * dVar26;
  if ((((0x7fefffffffffffff < (long)ABS(dStack_140f0)) ||
       (0x7fefffffffffffff < (long)ABS(dStack_140f8))) ||
      (0x7fefffffffffffff < (long)ABS(dStack_140b0))) ||
     (0x7fefffffffffffff < (ulong)ABS(dStack_14128.super_dgTemplateVector<double>.m_w))) {
LAB_0087f677:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
  }
  lStack_14070 = (long)(strideInBytes >> 3);
  lVar17 = face->m_incidentVertex * lStack_14070;
  dVar25 = (double)pHStack_14108[lVar17];
  dVar26 = (double)pHStack_14108[lVar17 + 1];
  dVar47 = (double)pHStack_14108[lVar17 + 2];
  if (((0x7fefffffffffffff < (ulong)ABS(dVar25)) || (0x7fefffffffffffff < (ulong)ABS(dVar26))) ||
     ((NAN(dVar26) || ((0x7fefffffffffffff < (ulong)ABS(dVar47) || (NAN(dVar47))))))) {
LAB_0087f6fd:
    __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                  ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
  }
  iVar22 = this->m_edgeMark;
  iVar18 = iVar22 + 1;
  this->m_edgeMark = iVar18;
  if (iVar18 != 0x7fffffff) {
    iVar22 = iVar22 + 2;
    this->m_edgeMark = iVar22;
    pdStack_14078 = this;
    if (iVar22 != 0x7fffffff) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dStack_140f0;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar26 * dStack_140f8;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar25;
      auVar24 = vfmadd231sd_fma(auVar27,auVar34,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dStack_140b0;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar47;
      auVar24 = vfmadd231sd_fma(auVar24,auVar42,auVar4);
      auVar11._8_8_ = 0x8000000000000000;
      auVar11._0_8_ = 0x8000000000000000;
      auStack_14068 = vxorpd_avx512vl(auVar24,auVar11);
      this_00 = (dgPolyhedra *)0x0;
      pdVar15 = face;
      do {
        pdVar15->m_mark = iVar22;
        aHStack_14038[(long)this_00] = pdVar15->m_incidentVertex;
        if (this_00 == (dgPolyhedra *)0xfff) {
          __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xc4d,
                        "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                       );
        }
        this_00 = (dgPolyhedra *)((long)&(this_00->super_dgTree<dgEdge,_long>)._vptr_dgTree + 1);
        pdVar15 = pdVar15->m_next;
      } while (pdVar15 != face);
      dStack_140a8 = (double)CONCAT44(dStack_140a8._4_4_,strideInBytes);
      uVar20 = 0;
      dStack_140a0 = dVar25;
      dStack_14098 = dVar47;
      dStack_14090 = dVar26;
      AddFace(pdStack_140e0,(HaI32)this_00,aHStack_14038,(HaI64 *)0x0);
      local_8038[0] = face;
      dStack_14140 = dStack_14128.super_dgTemplateVector<double>.m_x;
      dStack_14138 = dStack_14128.super_dgTemplateVector<double>.m_y;
      iStack_140e4 = 1;
      dStack_14130 = dStack_14128.super_dgTemplateVector<double>.m_z;
      dStack_140c8 = dStack_140b0;
      dStack_140c0 = dStack_140f8;
      dStack_140b8 = dStack_140f0;
      pool_00 = pHStack_14108;
      iVar18 = 1;
      do {
        pdVar15 = local_8038[(long)iVar18 + -1];
        apdStack_10038[(int)uVar20] = pdVar15;
        if (0xffe < (int)uVar20) {
          dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
          dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
          dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
          __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xc5a,
                        "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                       );
        }
        if (pdVar15->m_next->m_next->m_next != pdVar15) {
          dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
          dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
          dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
          __assert_fail("face->m_next->m_next->m_next == face",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                        ,0xc5b,
                        "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                       );
        }
        iStack_140fc = iVar18 + -1;
        uVar20 = uVar20 + 1;
        pdVar23 = pdVar15;
        do {
          face_00 = pdVar23->m_twin;
          if ((0 < face_00->m_incidentFace) && (face_00->m_mark != iVar22)) {
            uVar19 = 0;
            pdVar16 = face_00;
            do {
              pdVar16->m_mark = iVar22;
              aHStack_14038[uVar19] = pdVar16->m_incidentVertex;
              if (uVar19 == 0x1000) {
                dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
                dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
                dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
                __assert_fail("faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0]))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xc67,
                              "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                             );
              }
              uVar19 = uVar19 + 1;
              pdVar16 = pdVar16->m_next;
            } while (pdVar16 != face_00);
            FaceNormal(&dStack_14058,this_00,face_00,pool_00,dStack_140a8._0_4_);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = dStack_14058.super_dgTemplateVector<double>.m_x;
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 dStack_14058.super_dgTemplateVector<double>.m_y *
                 dStack_14058.super_dgTemplateVector<double>.m_y;
            auVar24 = vfmadd231sd_fma(auVar28,auVar46,auVar46);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dStack_14058.super_dgTemplateVector<double>.m_z;
            auVar24 = vfmadd231sd_fma(auVar24,auVar48,auVar48);
            dVar25 = auVar24._0_8_;
            if (9.999999960041972e-13 <= dVar25) {
              if (dVar25 < 0.0) {
                dStack_140d0 = dStack_14058.super_dgTemplateVector<double>.m_x;
                dStack_14088 = dStack_14058.super_dgTemplateVector<double>.m_y;
                dStack_140d8 = dStack_14058.super_dgTemplateVector<double>.m_z;
                dVar33 = sqrt(dVar25);
                dVar25 = dStack_14088;
                dVar26 = dStack_140d0;
                dVar47 = dStack_140d8;
              }
              else {
                auVar24 = vsqrtsd_avx(auVar24,auVar24);
                dVar33 = auVar24._0_8_;
                dVar25 = dStack_14058.super_dgTemplateVector<double>.m_y;
                dVar26 = dStack_14058.super_dgTemplateVector<double>.m_x;
                dVar47 = dStack_14058.super_dgTemplateVector<double>.m_z;
              }
              dVar33 = 1.0 / dVar33;
              this_00 = (dgPolyhedra *)ABS(dVar26 * dVar33);
              if ((((0x7fefffffffffffff < (long)this_00) ||
                   (0x7fefffffffffffff < (long)ABS(dVar25 * dVar33))) ||
                  (0x7fefffffffffffff < (long)ABS(dVar47 * dVar33))) ||
                 (0x7fefffffffffffff < (ulong)ABS(dStack_14058.super_dgTemplateVector<double>.m_w)))
              goto LAB_0087f653;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = dStack_140f0;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = dVar26 * dVar33;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = dVar25 * dVar33 * dStack_140f8;
              auVar24 = vfmadd132sd_fma(auVar29,auVar38,auVar5);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dStack_140b0;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = dVar47 * dVar33;
              auVar24 = vfmadd132sd_fma(auVar35,auVar24,auVar6);
              pool_00 = pHStack_14108;
              if (0.9998999834060669 <= auVar24._0_8_) {
                lVar17 = face_00->m_prev->m_incidentVertex * lStack_14070;
                dVar33 = (double)pHStack_14108[lVar17];
                dVar1 = (double)pHStack_14108[lVar17 + 1];
                dVar2 = (double)pHStack_14108[lVar17 + 2];
                dVar21 = ABS(dVar1);
                this_00 = (dgPolyhedra *)
                          CONCAT71((int7)((ulong)dVar21 >> 8),0x7fefffffffffffff < (ulong)dVar21);
                if (((0x7fefffffffffffff < (ulong)ABS(dVar33)) ||
                    (0x7fefffffffffffff < (ulong)dVar21)) ||
                   ((NAN(dVar1) || ((0x7fefffffffffffff < (ulong)ABS(dVar2) || (NAN(dVar2))))))) {
                  dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
                  dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
                  dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
                  goto LAB_0087f6fd;
                }
                auVar7._8_8_ = 0;
                auVar7._0_8_ = dStack_140b8;
                auVar30._8_8_ = 0;
                auVar30._0_8_ = dVar33;
                auVar43._8_8_ = 0;
                auVar43._0_8_ = dVar1 * dStack_140c0;
                auVar24 = vfmadd231sd_fma(auVar43,auVar30,auVar7);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = dStack_140c8;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = dVar2;
                auVar24 = vfmadd231sd_fma(auVar24,auVar39,auVar8);
                auVar12._8_8_ = 0x7fffffffffffffff;
                auVar12._0_8_ = 0x7fffffffffffffff;
                auVar44._8_8_ = 0;
                auVar44._0_8_ = auVar24._0_8_ + (double)auStack_14068._0_8_;
                auVar24 = vandpd_avx512vl(auVar44,auVar12);
                if (auVar24._0_8_ < 0.0078125) {
                  iStack_140e4 = iStack_140e4 + 1;
                  dVar33 = dStack_140a0 + dVar33;
                  dStack_14090 = dStack_14090 + dVar1;
                  dStack_14098 = dStack_14098 + dVar2;
                  dVar21 = 1.0 / (double)iStack_140e4;
                  dVar1 = dVar21 * dVar33;
                  dVar2 = dVar21 * dStack_14090;
                  dVar21 = dVar21 * dStack_14098;
                  if ((((long)ABS(dVar1) < 0x7ff0000000000000) &&
                      ((long)ABS(dVar2) < 0x7ff0000000000000)) &&
                     ((long)ABS(dVar21) < 0x7ff0000000000000)) {
                    dStack_14140 = dVar26 + dStack_14140;
                    dStack_14138 = dVar25 + dStack_14138;
                    dStack_14130 = dVar47 + dStack_14130;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = dStack_14138 * dStack_14138;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = dStack_14140;
                    auVar24 = vfmadd231sd_fma(auVar31,auVar40,auVar40);
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = dStack_14130;
                    auVar24 = vfmadd231sd_fma(auVar24,auVar36,auVar36);
                    uStack_14080 = 0;
                    dStack_140d8 = dVar2;
                    dStack_140d0 = dVar1;
                    dStack_140a0 = dVar33;
                    dStack_14088 = dVar21;
                    if (auVar24._0_8_ < 0.0) {
                      dStack_140c8 = sqrt(auVar24._0_8_);
                    }
                    else {
                      auVar24 = vsqrtsd_avx(auVar24,auVar24);
                      dStack_140c8 = auVar24._0_8_;
                    }
                    dStack_140c8 = 1.0 / dStack_140c8;
                    dStack_140b8 = dStack_140c8 * dStack_14140;
                    dStack_140c0 = dStack_140c8 * dStack_14138;
                    dStack_140c8 = dStack_140c8 * dStack_14130;
                    if ((((long)ABS(dStack_140b8) < 0x7ff0000000000000) &&
                        ((long)ABS(dStack_140c0) < 0x7ff0000000000000)) &&
                       ((long)ABS(dStack_140c8) < 0x7ff0000000000000)) {
                      this_00 = (dgPolyhedra *)(uVar19 & 0xffffffff);
                      AddFace(pdStack_140e0,(HaI32)uVar19,aHStack_14038,(HaI64 *)0x0);
                      local_8038[iStack_140fc] = face_00;
                      if (0xffe < iStack_140fc) {
                        dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
                        dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
                        dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
                        __assert_fail("index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0]))",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                                      ,0xc86,
                                      "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                                     );
                      }
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ = dStack_140d0;
                      auVar9._8_8_ = 0;
                      auVar9._0_8_ = dStack_140b8;
                      auVar32._8_8_ = 0;
                      auVar32._0_8_ = dStack_140d8 * dStack_140c0;
                      auVar24 = vfmadd132sd_fma(auVar37,auVar32,auVar9);
                      auVar14._8_8_ = uStack_14080;
                      auVar14._0_8_ = dStack_14088;
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = dStack_140c8;
                      auVar24 = vfmadd132sd_fma(auVar14,auVar24,auVar10);
                      auVar13._8_8_ = 0x8000000000000000;
                      auVar13._0_8_ = 0x8000000000000000;
                      auStack_14068 = vxorpd_avx512vl(auVar24,auVar13);
                      iStack_140fc = iStack_140fc + 1;
                      pool_00 = pHStack_14108;
                      goto LAB_0087f47d;
                    }
                  }
LAB_0087f653:
                  dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
                  dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
                  dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
                  goto LAB_0087f677;
                }
              }
            }
            else {
              apdStack_10038[(int)uVar20] = face_00;
              if (0xffe < (int)uVar20) {
                dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
                dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
                dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
                __assert_fail("deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0]))"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0xc71,
                              "void dgPolyhedra::MarkAdjacentCoplanarFaces(dgPolyhedra &, dgEdge *const, const hacd::HaF64 *const, hacd::HaI32)"
                             );
              }
              uVar20 = uVar20 + 1;
              pool_00 = pHStack_14108;
            }
          }
LAB_0087f47d:
          pdVar23 = pdVar23->m_next;
        } while (pdVar23 != pdVar15);
        iVar18 = iStack_140fc;
      } while (iStack_140fc != 0);
      dStack_14128.super_dgTemplateVector<double>.m_x = dStack_14140;
      dStack_14128.super_dgTemplateVector<double>.m_y = dStack_14138;
      dStack_14128.super_dgTemplateVector<double>.m_z = dStack_14130;
      EndFace(pdStack_140e0);
      this = pdStack_14078;
      goto LAB_0087f5dd;
    }
  }
  __assert_fail("m_edgeMark < 0x7fffffff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
}

Assistant:

void dgPolyhedra::MarkAdjacentCoplanarFaces (dgPolyhedra& polyhedraOut, dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 strideInBytes)
{
	const hacd::HaF64 normalDeviation = hacd::HaF64 (0.9999f);
	const hacd::HaF64 distanceFromPlane = hacd::HaF64 (1.0f / 128.0f);

	hacd::HaI32 faceIndex[1024 * 4];
	dgEdge* stack[1024 * 4];
	dgEdge* deleteEdge[1024 * 4];

	hacd::HaI32 deleteCount = 1;
	deleteEdge[0] = face;
	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF64));

	HACD_ASSERT (face->m_incidentFace > 0);

	dgBigVector normalAverage (FaceNormal (face, pool, strideInBytes));
	hacd::HaF64 dot = normalAverage % normalAverage;
	if (dot > hacd::HaF64 (1.0e-12f)) {
		hacd::HaI32 testPointsCount = 1;
		dot = hacd::HaF64 (1.0f) / sqrt (dot);
		dgBigVector normal (normalAverage.Scale (dot));

		dgBigVector averageTestPoint (&pool[face->m_incidentVertex * stride]);
		dgBigPlane testPlane(normal, - (averageTestPoint % normal));

		polyhedraOut.BeginFace();

		IncLRU();
		hacd::HaI32 faceMark = IncLRU();

		hacd::HaI32 faceIndexCount = 0;
		dgEdge* ptr = face;
		do {
			ptr->m_mark = faceMark;
			faceIndex[faceIndexCount] = ptr->m_incidentVertex;
			faceIndexCount ++;
			HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
			ptr = ptr ->m_next;
		} while (ptr != face);
		polyhedraOut.AddFace(faceIndexCount, faceIndex);

		hacd::HaI32 index = 1;
		deleteCount = 0;
		stack[0] = face;
		while (index) {
			index --;
			dgEdge* const face = stack[index];
			deleteEdge[deleteCount] = face;
			deleteCount ++;
			HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
			HACD_ASSERT (face->m_next->m_next->m_next == face);

			dgEdge* edge = face;
			do {
				dgEdge* const ptr = edge->m_twin;
				if (ptr->m_incidentFace > 0) {
					if (ptr->m_mark != faceMark) {
						dgEdge* ptr1 = ptr;
						faceIndexCount = 0;
						do {
							ptr1->m_mark = faceMark;
							faceIndex[faceIndexCount] = ptr1->m_incidentVertex;
							HACD_ASSERT (faceIndexCount < hacd::HaI32 (sizeof (faceIndex) / sizeof (faceIndex[0])));
							faceIndexCount ++;
							ptr1 = ptr1 ->m_next;
						} while (ptr1 != ptr);

						dgBigVector normal1 (FaceNormal (ptr, pool, strideInBytes));
						dot = normal1 % normal1;
						if (dot < hacd::HaF64 (1.0e-12f)) {
							deleteEdge[deleteCount] = ptr;
							deleteCount ++;
							HACD_ASSERT (deleteCount < hacd::HaI32 (sizeof (deleteEdge) / sizeof (deleteEdge[0])));
						} else {
							//normal1 = normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot));
							dgBigVector testNormal (normal1.Scale (hacd::HaF64 (1.0f) / sqrt (dot)));
							dot = normal % testNormal;
							if (dot >= normalDeviation) {
								dgBigVector testPoint (&pool[ptr->m_prev->m_incidentVertex * stride]);
								hacd::HaF64 dist = fabs (testPlane.Evalue (testPoint));
								if (dist < distanceFromPlane) {
									testPointsCount ++;

									averageTestPoint += testPoint;
									testPoint = averageTestPoint.Scale (hacd::HaF64 (1.0f) / hacd::HaF64(testPointsCount));

									normalAverage += normal1;
									testNormal = normalAverage.Scale (hacd::HaF64 (1.0f) / sqrt (normalAverage % normalAverage));
									testPlane = dgBigPlane (testNormal, - (testPoint % testNormal));

									polyhedraOut.AddFace(faceIndexCount, faceIndex);;
									stack[index] = ptr;
									index ++;
									HACD_ASSERT (index < hacd::HaI32 (sizeof (stack) / sizeof (stack[0])));
								}
							}
						}
					}
				}

				edge = edge->m_next;
			} while (edge != face);
		}
		polyhedraOut.EndFace();
	}

	for (hacd::HaI32 index = 0; index < deleteCount; index ++) {
		DeleteFace (deleteEdge[index]);
	}
}